

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O2

double webfront::log::anon_unknown_4::log(double __x)

{
  long *in_RDX;
  double extraout_XMM0_Qa;
  string_view fmt;
  string_view t;
  char local_c9;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_c8;
  uint local_bc;
  string_view text_local;
  string local_a8;
  char *local_88;
  string local_80;
  path local_60;
  path local_38;
  
  local_c9 = 'D';
  local_c8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  if ((undefined8 *)*in_RDX == (undefined8 *)0x0) {
    local_88 = "";
  }
  else {
    local_88 = *(char **)*in_RDX;
  }
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_38,&local_88,auto_format);
  http::std::filesystem::__cxx11::path::filename(&local_60,&local_38);
  http::std::filesystem::__cxx11::path::string(&local_80,&local_60);
  if (*in_RDX == 0) {
    local_bc = 0;
  }
  else {
    local_bc = *(uint *)(*in_RDX + 0x10);
  }
  fmt._M_str = "[{}] {:%T} | {:16}:{:4} | {}";
  fmt._M_len = 0x1c;
  std::
  format<char,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::__cxx11::string,unsigned_int,std::basic_string_view<char,std::char_traits<char>>&>
            (&local_a8,fmt,&local_c9,&local_c8,&local_80,&local_bc,&text_local);
  t._M_str = local_a8._M_dataplus._M_p;
  t._M_len = local_a8._M_string_length;
  Sinks::operator()((Sinks *)&out,t);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_80);
  http::std::filesystem::__cxx11::path::~path(&local_60);
  http::std::filesystem::__cxx11::path::~path(&local_38);
  return extraout_XMM0_Qa;
}

Assistant:

inline static void log(LogType l, string_view text, const srcLoc& s) {
        out(format("[{}] {:%T} | {:16}:{:4} | {}", toChar(l), chrono::system_clock::now(), filesystem::path(s.file_name()).filename().string(), s.line(), text));
    }